

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void WriteToSldFile(int pageNum,int value,char type,char *symbol)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *local_88;
  reference local_80;
  bool local_69;
  char *macroFN;
  undefined8 local_58;
  uint32_t local_50;
  TextFilePos *local_48;
  TextFilePos *defPos;
  TextFilePos *curPos;
  bool has_def_pos;
  char *pcStack_30;
  bool outside_source;
  char *symbol_local;
  int local_20;
  int iStack_1c;
  char type_local;
  int value_local;
  int pageNum_local;
  
  if ((FP_SourceLevelDebugging != (FILE *)0x0) && (type != '\0')) {
    pcStack_30 = symbol;
    if (symbol == (char *)0x0) {
      pcStack_30 = WriteToSld_noSymbol;
    }
    symbol_local._7_1_ = type;
    local_20 = value;
    iStack_1c = pageNum;
    bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                    ,0x5af,"void WriteToSldFile(int, int, char, const char *)");
    }
    sVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&sourcePosStack);
    curPos._7_1_ = sVar3 <= (ulong)(long)IncludeLevel;
    local_69 = false;
    if (!(bool)curPos._7_1_) {
      iVar2 = IncludeLevel + 1;
      sVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&sourcePosStack);
      local_69 = (ulong)(long)iVar2 < sVar3;
    }
    curPos._6_1_ = local_69;
    if ((curPos._7_1_ & 1) == 0) {
      local_80 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                           (&sourcePosStack,(long)IncludeLevel);
    }
    else {
      local_80 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    }
    defPos = local_80;
    if ((curPos._6_1_ & 1) == 0) {
      TextFilePos::TextFilePos((TextFilePos *)&macroFN,(char *)0x0,0);
    }
    else {
      pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
      macroFN = pvVar4->filename;
      local_58._0_4_ = pvVar4->line;
      local_58._4_4_ = pvVar4->colBegin;
      local_50 = pvVar4->colEnd;
    }
    local_48 = (TextFilePos *)&macroFN;
    if ((macroFN == (char *)0x0) || (iVar2 = strcmp(macroFN,defPos->filename), iVar2 == 0)) {
      local_88 = "";
    }
    else {
      local_88 = local_48->filename;
    }
    WriteToSldFile_TextFilePos(sldMessage_sourcePos,defPos);
    WriteToSldFile_TextFilePos(sldMessage_definitionPos,local_48);
    snprintf(sldMessage,0x1000,"%s|%s|%s|%s|%d|%d|%c|%s\n",defPos->filename,sldMessage_sourcePos,
             local_88,sldMessage_definitionPos,iStack_1c,local_20,(int)symbol_local._7_1_,pcStack_30
            );
    fputs(sldMessage,(FILE *)FP_SourceLevelDebugging);
  }
  return;
}

Assistant:

void WriteToSldFile(int pageNum, int value, char type, const char* symbol) {
	// SLD line format:
	// <file name>|<source line>|<definition file>|<definition line>|<page number>|<value>|<type>|<data>\n
	//
	// * string <file name> can't be empty (empty is for specific "control lines" with different format)
	//
	// * unsigned <source line> when <file name> is not empty, line number (in human way starting at 1)
	// The actual format is "%d[:%d[:%d]]", first number is always line. If second number is present,
	// that's the start column (in bytes), and if also third number is present, that's end column.
	//
	// * string <definition file> where the <definition line> was defined, if empty, it's equal to <file name>
	//
	// * unsigned <definition line> explicit zero value in regular source, but inside macros
	// the <source line> keeps pointing at line emitting the macro, while this value points
	// to source with actual definitions of instructions/etc (nested macro in macro <source line>
	// still points at the top level source which initiated it).
	// The format is again "%d[:%d[:%d]]" same as <source line>, optionally including the columns data.
	//
	// * int <value> is not truncated to page range, but full 16b Z80 address or even 32b value (equ)
	//
	// * string <data> content depends on char <type>:
	// 'T' = instruction Trace, empty data
	// 'D' = EQU symbol, <data> is the symbol name ("label")
	// 'F' = function label, <data> is the symbol name
	// 'Z' = device (memory model) changed, <data> has special custom formatting
	//
	// 'Z' device <data> format:
	// pages.size:<page size>,pages.count:<page count>,slots.count:<slots count>[,slots.adr:<slot0 adr>,...,<slotLast adr>]
	// unsigned <page size> is also any-slot size in current version.
	// unsigned <page count> and <slots count> define how many pages/slots there are
	// uint16_t <slotX adr> is starting address of slot memory region in Z80 16b addressing
	//
	// specific lines (<file name> string was empty):
	// |SLD.data.version|<version number>
	// <version number> is SLD file format version, currently should be 0
	// ||<anything till EOL>
	// comment line, not to be parsed
	if (nullptr == FP_SourceLevelDebugging || !type) return;
	if (nullptr == symbol) symbol = WriteToSld_noSymbol;

	assert(!sourcePosStack.empty());
	const bool outside_source = (sourcePosStack.size() <= size_t(IncludeLevel));
	const bool has_def_pos = !outside_source && (size_t(IncludeLevel + 1) < sourcePosStack.size());
	const TextFilePos & curPos = outside_source ? sourcePosStack.back() : sourcePosStack.at(IncludeLevel);
	const TextFilePos & defPos = has_def_pos ? sourcePosStack.back() : TextFilePos();

	const char* macroFN = defPos.filename && strcmp(defPos.filename, curPos.filename) ? defPos.filename : "";
	WriteToSldFile_TextFilePos(sldMessage_sourcePos, curPos);
	WriteToSldFile_TextFilePos(sldMessage_definitionPos, defPos);
	snprintf(sldMessage, LINEMAX2, "%s|%s|%s|%s|%d|%d|%c|%s\n",
				curPos.filename, sldMessage_sourcePos, macroFN, sldMessage_definitionPos,
				pageNum, value, type, symbol);
	fputs(sldMessage, FP_SourceLevelDebugging);
}